

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

void getPossibleBiomesForLimits(char *ids,int mc,int (*limits) [2])

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  void *in_RDI;
  int *bp;
  int j;
  int i;
  int *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int local_1c;
  
  memset(in_RDI,0,0x100);
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    iVar1 = isOverworld(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if ((iVar1 != 0) &&
       (in_stack_ffffffffffffffd8 = getBiomeParaLimits(in_ESI,local_1c),
       in_stack_ffffffffffffffd8 != (int *)0x0)) {
      in_stack_ffffffffffffffe0 = 0;
      while (((in_stack_ffffffffffffffe0 < 6 &&
              (*(int *)(in_RDX + (long)in_stack_ffffffffffffffe0 * 8) <=
               in_stack_ffffffffffffffd8[in_stack_ffffffffffffffe0 * 2 + 1])) &&
             (in_stack_ffffffffffffffd8[in_stack_ffffffffffffffe0 << 1] <=
              *(int *)(in_RDX + 4 + (long)in_stack_ffffffffffffffe0 * 8)))) {
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1;
      }
      if (5 < in_stack_ffffffffffffffe0) {
        *(undefined1 *)((long)in_RDI + (long)in_stack_ffffffffffffffd8[-1]) = 1;
      }
    }
  }
  return;
}

Assistant:

void getPossibleBiomesForLimits(char ids[256], int mc, int limits[6][2])
{
    int i, j;
    memset(ids, 0, 256*sizeof(char));

    for (i = 0; i < 256; i++)
    {
        if (!isOverworld(mc, i))
            continue;
        const int *bp = getBiomeParaLimits(mc, i);
        if (!bp)
            continue;

        for (j = 0; j < 6; j++)
        {
            if (limits[j][0] > bp[2*j+1] || limits[j][1] < bp[2*j+0])
                break;
        }
        if (j >= 6)
            ids[bp[-1]] = 1;
    }
}